

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  internal *piVar5;
  TestResult *this;
  TestInfo *pTVar6;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *result;
  int local_2e4;
  undefined1 local_2e0 [4];
  int i;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  int local_1dc;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  int local_18c;
  string local_188;
  allocator<char> local_161;
  string local_160;
  int local_13c;
  string local_138;
  allocator<char> local_111;
  string local_110;
  int local_ec;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string kTestsuite;
  TestSuite *test_suite_local;
  ostream *stream_local;
  
  kTestsuite.field_2._8_8_ = test_suite;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"testsuite",&local_39);
  std::allocator<char>::~allocator(&local_39);
  poVar3 = std::operator<<(stream,"  <");
  std::operator<<(poVar3,(string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"name",&local_71);
  pcVar4 = TestSuite::name((TestSuite *)kTestsuite.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar4,&local_99);
  OutputXmlAttribute(stream,(string *)local_38,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"tests",&local_c1);
  local_ec = TestSuite::reportable_test_count((TestSuite *)kTestsuite.field_2._8_8_);
  StreamableToString<int>(&local_e8,&local_ec);
  OutputXmlAttribute(stream,(string *)local_38,&local_c0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"failures",&local_111);
    local_13c = TestSuite::failed_test_count((TestSuite *)kTestsuite.field_2._8_8_);
    StreamableToString<int>(&local_138,&local_13c);
    OutputXmlAttribute(stream,(string *)local_38,&local_110,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"disabled",&local_161);
    local_18c = TestSuite::reportable_disabled_test_count((TestSuite *)kTestsuite.field_2._8_8_);
    StreamableToString<int>(&local_188,&local_18c);
    OutputXmlAttribute(stream,(string *)local_38,&local_160,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"skipped",&local_1b1);
    local_1dc = TestSuite::skipped_test_count((TestSuite *)kTestsuite.field_2._8_8_);
    StreamableToString<int>(&local_1d8,&local_1dc);
    OutputXmlAttribute(stream,(string *)local_38,&local_1b0,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"errors",&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"0",&local_229);
    OutputXmlAttribute(stream,(string *)local_38,&local_200,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"time",&local_251);
    piVar5 = (internal *)TestSuite::elapsed_time((TestSuite *)kTestsuite.field_2._8_8_);
    FormatTimeInMillisAsSeconds_abi_cxx11_(&local_278,piVar5,ms);
    OutputXmlAttribute(stream,(string *)local_38,&local_250,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"timestamp",&local_299);
    piVar5 = (internal *)TestSuite::start_timestamp((TestSuite *)kTestsuite.field_2._8_8_);
    FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_2c0,piVar5,ms_00);
    OutputXmlAttribute(stream,(string *)local_38,&local_298,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    this = TestSuite::ad_hoc_test_result((TestSuite *)kTestsuite.field_2._8_8_);
    TestPropertiesAsXmlAttributes_abi_cxx11_
              ((string *)local_2e0,(XmlUnitTestResultPrinter *)this,result);
    std::operator<<(stream,(string *)local_2e0);
    std::__cxx11::string::~string((string *)local_2e0);
  }
  std::operator<<(stream,">\n");
  for (local_2e4 = 0; iVar2 = TestSuite::total_test_count((TestSuite *)kTestsuite.field_2._8_8_),
      local_2e4 < iVar2; local_2e4 = local_2e4 + 1) {
    pTVar6 = TestSuite::GetTestInfo((TestSuite *)kTestsuite.field_2._8_8_,local_2e4);
    bVar1 = TestInfo::is_reportable(pTVar6);
    if (bVar1) {
      pcVar4 = TestSuite::name((TestSuite *)kTestsuite.field_2._8_8_);
      pTVar6 = TestSuite::GetTestInfo((TestSuite *)kTestsuite.field_2._8_8_,local_2e4);
      OutputXmlTestInfo(stream,pcVar4,pTVar6);
    }
  }
  poVar3 = std::operator<<(stream,"  </");
  poVar3 = std::operator<<(poVar3,(string *)local_38);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestSuite(std::ostream* stream,
                                                 const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_suite.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_suite.reportable_test_count()));
  if (!GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "failures",
                       StreamableToString(test_suite.failed_test_count()));
    OutputXmlAttribute(
        stream, kTestsuite, "disabled",
        StreamableToString(test_suite.reportable_disabled_test_count()));
    OutputXmlAttribute(stream, kTestsuite, "skipped",
                       StreamableToString(test_suite.skipped_test_count()));

    OutputXmlAttribute(stream, kTestsuite, "errors", "0");

    OutputXmlAttribute(stream, kTestsuite, "time",
                       FormatTimeInMillisAsSeconds(test_suite.elapsed_time()));
    OutputXmlAttribute(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsIso8601(test_suite.start_timestamp()));
    *stream << TestPropertiesAsXmlAttributes(test_suite.ad_hoc_test_result());
  }
  *stream << ">\n";
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}